

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeViewPrivate::updateScrollBars(QTreeViewPrivate *this)

{
  QAbstractScrollArea *this_00;
  long lVar1;
  int iVar2;
  int iVar3;
  QSize QVar4;
  Representation step;
  int width;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int height;
  int iVar8;
  
  this_00 = *(QAbstractScrollArea **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QVar4 = QWidget::size((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        viewport);
  uVar6 = (ulong)QVar4 >> 0x20;
  step.m_i = 0;
  if (((ulong)QVar4 & 0x8000000080000000) == 0) {
    step = QVar4.wd.m_i;
  }
  else {
    uVar6 = 0;
  }
  QAbstractItemViewPrivate::executePostedLayout(&this->super_QAbstractItemViewPrivate);
  if ((this->viewItems).d.size == 0) {
    (**(code **)(*(long *)this_00 + 0x220))(this_00);
  }
  iVar2 = (int)uVar6;
  if (this->uniformRowHeights == true) {
    if (this->defaultItemHeight < 1) {
      iVar5 = (int)(this->viewItems).d.size;
    }
    else {
      iVar5 = (int)(uVar6 / (uint)this->defaultItemHeight);
    }
  }
  else {
    iVar7 = (int)(this->viewItems).d.size;
    iVar5 = 0;
    iVar8 = 0;
    while (0 < iVar7) {
      iVar7 = iVar7 + -1;
      iVar3 = itemHeight(this,iVar7);
      iVar8 = iVar8 + iVar3;
      if (iVar2 < iVar8) break;
      iVar5 = iVar5 + 1;
    }
  }
  if ((this->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
    lVar1 = (this->viewItems).d.size;
    iVar2 = 1;
    if (1 < iVar5) {
      iVar2 = iVar5;
    }
    if (lVar1 == 0) {
      iVar2 = iVar5;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,0,(int)lVar1 - iVar2);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,iVar2);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,1);
  }
  else {
    if (this->uniformRowHeights == false) {
      iVar7 = 0;
      for (uVar6 = 0; uVar6 < (ulong)(this->viewItems).d.size; uVar6 = uVar6 + 1) {
        iVar8 = itemHeight(this,(int)uVar6);
        iVar7 = iVar7 + iVar8;
      }
    }
    else {
      iVar7 = this->defaultItemHeight * (int)(this->viewItems).d.size;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,0,iVar7 - iVar2);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,iVar2);
    iVar2 = iVar2 / (iVar5 + 1);
    if (iVar2 < 3) {
      iVar2 = 2;
    }
    QAbstractSliderPrivate::itemviewChangeSingleStep
              (*(QAbstractSliderPrivate **)
                &(((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                 super_QAbstractSlider).super_QWidget.field_0x8,iVar2);
  }
  iVar7 = QHeaderView::count(this->header);
  iVar8 = 0;
  iVar5 = 0;
  iVar2 = iVar7;
  while (0 < iVar2) {
    iVar2 = iVar2 + -1;
    iVar3 = QHeaderView::logicalIndex(this->header,iVar2);
    iVar3 = QHeaderView::sectionSize(this->header,iVar3);
    iVar5 = iVar5 + iVar3;
    if (step.m_i < iVar5) break;
    iVar8 = iVar8 + 1;
  }
  iVar2 = iVar8 + (uint)(iVar8 == 0);
  if (iVar7 < 1) {
    iVar2 = iVar8;
  }
  if ((this->super_QAbstractItemViewPrivate).horizontalScrollMode == ScrollPerItem) {
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,0,iVar7 - iVar2);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,iVar2);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,1);
    return;
  }
  iVar7 = QHeaderView::length(this->header);
  QVar4 = QAbstractScrollArea::maximumViewportSize(this_00);
  if ((iVar7 <= QVar4.wd.m_i.m_i) &&
     (iVar5 = QAbstractSlider::maximum
                        (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                          vbar)->super_QAbstractSlider), iVar5 < 1)) {
    step.m_i = QVar4.wd.m_i.m_i;
  }
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,step.m_i);
  iVar7 = iVar7 - step.m_i;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  QAbstractSlider::setRange
            (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,0,iVar7);
  iVar7 = step.m_i / (iVar2 + 1);
  iVar2 = 2;
  if (2 < iVar7) {
    iVar2 = iVar7;
  }
  QAbstractSliderPrivate::itemviewChangeSingleStep
            (*(QAbstractSliderPrivate **)
              &(((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
               super_QAbstractSlider).super_QWidget.field_0x8,iVar2);
  return;
}

Assistant:

void QTreeViewPrivate::updateScrollBars()
{
    Q_Q(QTreeView);
    QSize viewportSize = viewport->size();
    if (!viewportSize.isValid())
        viewportSize = QSize(0, 0);

    executePostedLayout();
    if (viewItems.isEmpty()) {
        q->doItemsLayout();
    }

    int itemsInViewport = 0;
    if (uniformRowHeights) {
        if (defaultItemHeight <= 0)
            itemsInViewport = viewItems.size();
        else
            itemsInViewport = viewportSize.height() / defaultItemHeight;
    } else {
        const int itemsCount = viewItems.size();
        const int viewportHeight = viewportSize.height();
        for (int height = 0, item = itemsCount - 1; item >= 0; --item) {
            height += itemHeight(item);
            if (height > viewportHeight)
                break;
            ++itemsInViewport;
        }
    }
    if (verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (!viewItems.isEmpty())
            itemsInViewport = qMax(1, itemsInViewport);
        vbar->setRange(0, viewItems.size() - itemsInViewport);
        vbar->setPageStep(itemsInViewport);
        vbar->setSingleStep(1);
    } else { // scroll per pixel
        int contentsHeight = 0;
        if (uniformRowHeights) {
            contentsHeight = defaultItemHeight * viewItems.size();
        } else { // ### (maybe do like QHeaderView by letting items have startposition)
            for (int i = 0; i < viewItems.size(); ++i)
                contentsHeight += itemHeight(i);
        }
        vbar->setRange(0, contentsHeight - viewportSize.height());
        vbar->setPageStep(viewportSize.height());
        vbar->d_func()->itemviewChangeSingleStep(qMax(viewportSize.height() / (itemsInViewport + 1), 2));
    }

    const int columnCount = header->count();
    const int viewportWidth = viewportSize.width();
    int columnsInViewport = 0;
    for (int width = 0, column = columnCount - 1; column >= 0; --column) {
        int logical = header->logicalIndex(column);
        width += header->sectionSize(logical);
        if (width > viewportWidth)
            break;
        ++columnsInViewport;
    }
    if (columnCount > 0)
        columnsInViewport = qMax(1, columnsInViewport);
    if (horizontalScrollMode == QAbstractItemView::ScrollPerItem) {
        hbar->setRange(0, columnCount - columnsInViewport);
        hbar->setPageStep(columnsInViewport);
        hbar->setSingleStep(1);
    } else { // scroll per pixel
        const int horizontalLength = header->length();
        const QSize maxSize = q->maximumViewportSize();
        if (maxSize.width() >= horizontalLength && vbar->maximum() <= 0)
            viewportSize = maxSize;
        hbar->setPageStep(viewportSize.width());
        hbar->setRange(0, qMax(horizontalLength - viewportSize.width(), 0));
        hbar->d_func()->itemviewChangeSingleStep(qMax(viewportSize.width() / (columnsInViewport + 1), 2));
    }
}